

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn_graph.h
# Opt level: O3

void __thiscall
gnns::Knn_Graph<L2Distance<float>_>::nth_index_element
          (Knn_Graph<L2Distance<float>_> *this,DistanceType *dist,size_t_conflict length,
          DistanceType *elements,IndexType *indices,size_t_conflict n)

{
  long lVar1;
  pair<float,_unsigned_int> pVar2;
  pair<float,_unsigned_int> *ppVar3;
  ulong uVar4;
  ulong uVar5;
  pair<float,_unsigned_int> *ppVar6;
  vector<std::pair<float,_unsigned_int>,_std::allocator<std::pair<float,_unsigned_int>_>_> v;
  pair<float,_unsigned_int> local_58;
  size_t_conflict local_4c;
  pair<float,_unsigned_int> *local_48;
  iterator iStack_40;
  pair<float,_unsigned_int> *local_38;
  
  local_48 = (pair<float,_unsigned_int> *)0x0;
  iStack_40._M_current = (pair<float,_unsigned_int> *)0x0;
  local_38 = (pair<float,_unsigned_int> *)0x0;
  if (length == 0) {
    uVar5 = (ulong)n;
  }
  else {
    uVar5 = 0;
    local_4c = n;
    do {
      local_58.first = dist[uVar5];
      local_58.second = (uint)uVar5;
      if (iStack_40._M_current == local_38) {
        std::vector<std::pair<float,unsigned_int>,std::allocator<std::pair<float,unsigned_int>>>::
        _M_realloc_insert<std::pair<float,unsigned_int>>
                  ((vector<std::pair<float,unsigned_int>,std::allocator<std::pair<float,unsigned_int>>>
                    *)&local_48,iStack_40,&local_58);
      }
      else {
        pVar2.second = local_58.second;
        pVar2.first = local_58.first;
        *iStack_40._M_current = pVar2;
        iStack_40._M_current = iStack_40._M_current + 1;
      }
      n = local_4c;
      uVar5 = uVar5 + 1;
    } while (length != uVar5);
    uVar5 = (ulong)local_4c;
    if (local_48 + uVar5 + 1 != iStack_40._M_current && local_48 != iStack_40._M_current) {
      uVar4 = (long)iStack_40._M_current - (long)local_48 >> 3;
      lVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introselect<__gnu_cxx::__normal_iterator<std::pair<float,unsigned_int>*,std::vector<std::pair<float,unsigned_int>,std::allocator<std::pair<float,unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_48,local_48 + uVar5 + 1,iStack_40._M_current,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e)
      ;
    }
  }
  ppVar3 = local_48;
  ppVar6 = local_48 + uVar5 + 1;
  uVar4 = uVar5 * 8 + 8 >> 3;
  lVar1 = 0x3f;
  if (uVar4 != 0) {
    for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  std::
  __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<float,unsigned_int>*,std::vector<std::pair<float,unsigned_int>,std::allocator<std::pair<float,unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
            (local_48,ppVar6,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
  std::
  __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<float,unsigned_int>*,std::vector<std::pair<float,unsigned_int>,std::allocator<std::pair<float,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (ppVar3,ppVar6);
  if (n == 0) {
    if (local_48 == (pair<float,_unsigned_int> *)0x0) {
      return;
    }
  }
  else {
    uVar4 = 0;
    do {
      elements[uVar4] = local_48[uVar4 + 1].first;
      indices[uVar4] = local_48[uVar4 + 1].second;
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  operator_delete(local_48);
  return;
}

Assistant:

void nth_index_element(DistanceType* dist, const size_t length, DistanceType* elements, IndexType* indices, const size_t n)
        {
            //construct a vector with index
            std::vector<std::pair<DistanceType, IndexType>> v;
            for(int i=0;i<length;++i)
                v.push_back(std::pair<DistanceType, size_t>(dist[i], i));

            //since it contain the point itself and find n+1 minimum elements
            std::nth_element(v.begin(), v.begin()+n+1, v.end());
            std::sort(v.begin(), v.begin()+n+1);
            //eliminate the first element(itself)
            for(size_t i=0;i<n;++i)
            {
                elements[i] = v[i+1].first;
                indices[i] = v[i+1].second;
            }
        }